

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void M_Unlock(Matrix *M)

{
  Matrix *M_local;
  
  if (((M != (Matrix *)0x0) && (M->LockLevel = M->LockLevel + -1, M->Instance == Tempor)) &&
     (M->LockLevel < 1)) {
    M_Destr(M);
    free(M);
  }
  return;
}

Assistant:

void M_Unlock(Matrix *M)
/* unlock the matrix M */
{
    if (M != NULL) {
        M->LockLevel--;
        if (M->Instance == Tempor && M->LockLevel <= 0) {
            M_Destr(M); 
	    free(M);
	}
    }
}